

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O0

void ncnn::pack_B_tile_fp32_to_int8_avx2
               (Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float in_stack_00000504;
  int in_stack_00000508;
  int in_stack_0000050c;
  int in_stack_00000510;
  int in_stack_00000514;
  Mat *in_stack_00000518;
  Mat *in_stack_00000520;
  
  pack_B_tile_fp32_to_int8
            (in_stack_00000520,in_stack_00000518,in_stack_00000514,in_stack_00000510,
             in_stack_0000050c,in_stack_00000508,in_stack_00000504);
  return;
}

Assistant:

void pack_B_tile_fp32_to_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}